

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void lyxp_set_scnode_merge(lyxp_set *set1,lyxp_set *set2)

{
  uint32_t uVar1;
  lyxp_set_scnode *plVar2;
  lyxp_set_scnode *plVar3;
  lyxp_set_scnode *plVar4;
  lyxp_set_scnode *plVar5;
  undefined4 uVar6;
  lyxp_node_type lVar7;
  int32_t iVar8;
  uint uVar9;
  lyxp_set_node *plVar10;
  ulong uVar11;
  uint32_t *puVar12;
  uint32_t uVar13;
  
  if ((set1->type != LYXP_SET_SCNODE_SET) || (set2->type != LYXP_SET_SCNODE_SET)) {
    __assert_fail("(set1->type == LYXP_SET_SCNODE_SET) && (set2->type == LYXP_SET_SCNODE_SET)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x4ed,"void lyxp_set_scnode_merge(struct lyxp_set *, struct lyxp_set *)");
  }
  if (set2->used != 0) {
    if (set1->used == 0) {
      lyxp_set_free_content(set1);
      memcpy(set1,set2,0x90);
      return;
    }
    uVar9 = set1->used + set2->used;
    if (set1->size < uVar9) {
      set1->size = uVar9;
      plVar10 = (lyxp_set_node *)ly_realloc((set1->val).nodes,(ulong)uVar9 * 0x18);
      (set1->val).nodes = plVar10;
      if (plVar10 == (lyxp_set_node *)0x0) {
        ly_log(set1->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxp_set_scnode_merge"
              );
        return;
      }
    }
    if (set2->used != 0) {
      uVar1 = set1->used;
      uVar11 = 0;
      do {
        if (uVar1 != 0) {
          plVar10 = (set2->val).nodes;
          puVar12 = &((set1->val).nodes)->pos;
          uVar13 = uVar1;
          do {
            if (((lyxp_set_node *)(puVar12 + -3))->node ==
                *(lyd_node **)((long)plVar10 + uVar11 * 0x18)) {
              if (*puVar12 == 0) {
                if (*(int *)((long)plVar10 + uVar11 * 0x18 + 0xc) == 1) {
                  *puVar12 = 1;
                }
              }
              else if (*puVar12 == 0xffffffff) {
                *puVar12 = *(uint32_t *)((long)plVar10 + uVar11 * 0x18 + 0xc);
              }
              goto LAB_001a74b5;
            }
            puVar12 = puVar12 + 6;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        plVar2 = (set1->val).scnodes;
        uVar9 = set1->used;
        plVar3 = (set2->val).scnodes;
        plVar4 = plVar3 + uVar11;
        uVar6 = *(undefined4 *)&plVar4->field_0x14;
        plVar5 = plVar2 + uVar9;
        plVar5->axis = plVar4->axis;
        *(undefined4 *)&plVar5->field_0x14 = uVar6;
        plVar3 = plVar3 + uVar11;
        lVar7 = plVar3->type;
        iVar8 = plVar3->in_ctx;
        plVar2 = plVar2 + uVar9;
        plVar2->scnode = plVar3->scnode;
        plVar2->type = lVar7;
        plVar2->in_ctx = iVar8;
        set1->used = set1->used + 1;
LAB_001a74b5:
        uVar11 = uVar11 + 1;
      } while (uVar11 < set2->used);
    }
    lyxp_set_free_content(set2);
    set2->type = LYXP_SET_SCNODE_SET;
  }
  return;
}

Assistant:

void
lyxp_set_scnode_merge(struct lyxp_set *set1, struct lyxp_set *set2)
{
    uint32_t orig_used, i, j;

    assert((set1->type == LYXP_SET_SCNODE_SET) && (set2->type == LYXP_SET_SCNODE_SET));

    if (!set2->used) {
        return;
    }

    if (!set1->used) {
        /* release hidden allocated data (lyxp_set.size) */
        lyxp_set_free_content(set1);
        /* direct copying of the entire structure */
        memcpy(set1, set2, sizeof *set1);
        return;
    }

    if (set1->used + set2->used > set1->size) {
        set1->size = set1->used + set2->used;
        set1->val.scnodes = ly_realloc(set1->val.scnodes, set1->size * sizeof *set1->val.scnodes);
        LY_CHECK_ERR_RET(!set1->val.scnodes, LOGMEM(set1->ctx), );
    }

    orig_used = set1->used;

    for (i = 0; i < set2->used; ++i) {
        for (j = 0; j < orig_used; ++j) {
            /* detect duplicities */
            if (set1->val.scnodes[j].scnode == set2->val.scnodes[i].scnode) {
                break;
            }
        }

        if (j < orig_used) {
            /* node is there, but update its status if needed */
            if (set1->val.scnodes[j].in_ctx == LYXP_SET_SCNODE_START_USED) {
                set1->val.scnodes[j].in_ctx = set2->val.scnodes[i].in_ctx;
            } else if ((set1->val.scnodes[j].in_ctx == LYXP_SET_SCNODE_ATOM_NODE) &&
                    (set2->val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_VAL)) {
                set1->val.scnodes[j].in_ctx = set2->val.scnodes[i].in_ctx;
            }
        } else {
            memcpy(&set1->val.scnodes[set1->used], &set2->val.scnodes[i], sizeof *set2->val.scnodes);
            ++set1->used;
        }
    }

    lyxp_set_free_content(set2);
    set2->type = LYXP_SET_SCNODE_SET;
}